

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O3

Vec_Wec_t * Seg_ManCollectObjEdges(Vec_Int_t *vEdges,int nObjs)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Wec_t *pVVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int local_58;
  int local_54;
  
  pVVar4 = (Vec_Wec_t *)malloc(0x10);
  local_58 = 8;
  if (6 < nObjs - 1U) {
    local_58 = nObjs;
  }
  pVVar4->nCap = local_58;
  if (local_58 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)local_58,0x10);
  }
  pVVar4->pArray = pVVar5;
  pVVar4->nSize = nObjs;
  if (1 < vEdges->nSize) {
    lVar8 = 1;
    local_54 = 0;
    iVar6 = local_58;
    do {
      uVar1 = vEdges->pArray[lVar8 + -1];
      uVar2 = vEdges->pArray[lVar8];
      if (nObjs <= (int)uVar1) {
        iVar7 = uVar1 + 1;
        iVar3 = nObjs * 2;
        if (nObjs * 2 <= iVar7) {
          iVar3 = iVar7;
        }
        nObjs = iVar7;
        if (iVar3 - local_58 != 0 && local_58 <= iVar3) {
          if (pVVar5 == (Vec_Int_t *)0x0) {
            pVVar5 = (Vec_Int_t *)malloc((long)iVar3 << 4);
          }
          else {
            pVVar5 = (Vec_Int_t *)realloc(pVVar5,(long)iVar3 << 4);
          }
          pVVar4->pArray = pVVar5;
          memset(pVVar5 + local_58,0,(long)(iVar3 - local_58) << 4);
          pVVar4->nCap = iVar3;
          local_58 = iVar3;
          iVar6 = iVar3;
        }
      }
      if (((int)uVar1 < 0) || (nObjs <= (int)uVar1)) {
        pVVar4->nSize = nObjs;
LAB_007a72a9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      Vec_IntPush(pVVar5 + uVar1,local_54);
      if (nObjs <= (int)uVar2) {
        iVar7 = uVar2 + 1;
        iVar3 = nObjs * 2;
        if (nObjs * 2 <= iVar7) {
          iVar3 = iVar7;
        }
        local_58 = iVar6;
        nObjs = iVar7;
        if (iVar3 - iVar6 != 0 && iVar6 <= iVar3) {
          if (pVVar5 == (Vec_Int_t *)0x0) {
            pVVar5 = (Vec_Int_t *)malloc((long)iVar3 << 4);
          }
          else {
            pVVar5 = (Vec_Int_t *)realloc(pVVar5,(long)iVar3 << 4);
          }
          pVVar4->pArray = pVVar5;
          memset(pVVar5 + iVar6,0,(long)(iVar3 - iVar6) << 4);
          pVVar4->nCap = iVar3;
          local_58 = iVar3;
          iVar6 = iVar3;
        }
      }
      if (((int)uVar2 < 0) || (nObjs <= (int)uVar2)) {
        pVVar4->nSize = nObjs;
        goto LAB_007a72a9;
      }
      pVVar5 = pVVar4->pArray;
      Vec_IntPush(pVVar5 + uVar2,local_54);
      lVar8 = lVar8 + 2;
      local_54 = local_54 + 1;
    } while ((int)lVar8 < vEdges->nSize);
    pVVar4->nSize = nObjs;
  }
  return pVVar4;
}

Assistant:

Vec_Wec_t * Seg_ManCollectObjEdges( Vec_Int_t * vEdges, int nObjs )
{
    int iFanin, iObj, i;
    Vec_Wec_t * vRes = Vec_WecStart( nObjs );
    Vec_IntForEachEntryDouble( vEdges, iFanin, iObj, i )
    {
        Vec_WecPush( vRes, iFanin, i/2 );
        Vec_WecPush( vRes, iObj, i/2 );
    }
    return vRes;
}